

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O0

Type * __thiscall
SListBase<IR::RegOpnd*,Memory::ArenaAllocator,RealCount>::
Find<Func::GetConstantAddressIndirOpnd(long,IR::Opnd*,IR::AddrOpndKind,IRType,Js::OpCode)::__0>
          (SListBase<IR::RegOpnd*,Memory::ArenaAllocator,RealCount> *this,
          anon_class_16_2_42acc856 predicate)

{
  code *pcVar1;
  undefined1 this_00 [8];
  bool bVar2;
  undefined4 *puVar3;
  Type_conflict node;
  Type *ppRVar4;
  undefined1 local_48 [8];
  Iterator iter;
  SListBase<IR::RegOpnd_*,_Memory::ArenaAllocator,_RealCount> *this_local;
  anon_class_16_2_42acc856 predicate_local;
  
  predicate_local.address = (intptr_t)predicate.offset;
  this_local = (SListBase<IR::RegOpnd_*,_Memory::ArenaAllocator,_RealCount> *)predicate.address;
  iter.current = (NodeBase *)this;
  SListBase<IR::RegOpnd_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Iterator
            ((Iterator *)local_48,
             (SListBase<IR::RegOpnd_*,_Memory::ArenaAllocator,_RealCount> *)this);
  while( true ) {
    if (iter.list == (SListBase<IR::RegOpnd_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    this_00 = local_48;
    node = SListNodeBase<Memory::ArenaAllocator>::Next
                     (&(iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    bVar2 = SListBase<IR::RegOpnd_*,_Memory::ArenaAllocator,_RealCount>::IsHead
                      ((SListBase<IR::RegOpnd_*,_Memory::ArenaAllocator,_RealCount> *)this_00,node);
    if (bVar2) break;
    iter.list = (SListBase<IR::RegOpnd_*,_Memory::ArenaAllocator,_RealCount> *)
                SListNodeBase<Memory::ArenaAllocator>::Next
                          (&(iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    ppRVar4 = SListBase<IR::RegOpnd_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                        ((Iterator *)local_48);
    bVar2 = Func::GetConstantAddressIndirOpnd::anon_class_16_2_42acc856::operator()
                      ((anon_class_16_2_42acc856 *)&this_local,*ppRVar4);
    if (bVar2) {
      ppRVar4 = SListBase<IR::RegOpnd_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                          ((Iterator *)local_48);
      return ppRVar4;
    }
  }
  return (Type *)0x0;
}

Assistant:

Find(Fn predicate)
    {
        Iterator iter(this);
        while(iter.Next())
        {
            if(predicate(iter.Data()))
            {
                return &iter.Data();
            }
        }
        return nullptr;
    }